

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  Option opt_q;
  Mat local_198;
  Mat local_150;
  Mat local_108;
  Mat local_c0;
  Option local_78;
  
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,this->weight_data_size,1,(Allocator *)0x0);
    bVar4 = true;
    if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
      iVar5 = this->weight_data_size / this->group;
      if (0 < this->group) {
        sVar7 = (size_t)iVar5;
        lVar8 = 0;
        lVar6 = 0;
        do {
          local_78.lightmode = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78.num_threads = opt->num_threads;
          local_78.workspace_allocator = opt->workspace_allocator;
          local_78.openmp_blocktime = opt->openmp_blocktime;
          local_78.use_winograd_convolution = opt->use_winograd_convolution;
          local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_78.use_int8_inference = opt->use_int8_inference;
          local_78.use_vulkan_compute = opt->use_vulkan_compute;
          uVar3._0_1_ = opt->use_bf16_storage;
          uVar3._1_1_ = opt->use_fp16_packed;
          uVar3._2_1_ = opt->use_fp16_storage;
          uVar3._3_1_ = opt->use_fp16_arithmetic;
          uVar3._4_1_ = opt->use_int8_packed;
          uVar3._5_1_ = opt->use_int8_storage;
          uVar3._6_1_ = opt->use_int8_arithmetic;
          uVar3._7_1_ = opt->use_packing_layout;
          local_78.use_shader_pack8 = opt->use_shader_pack8;
          local_78.use_subgroup_basic = opt->use_subgroup_basic;
          local_78.use_subgroup_vote = opt->use_subgroup_vote;
          local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
          local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
          local_78.use_image_storage = opt->use_image_storage;
          local_78.use_tensor_storage = opt->use_tensor_storage;
          local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
          local_78.flush_denormals = opt->flush_denormals;
          local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
          local_78.use_reserved_1 = opt->use_reserved_1;
          local_78.use_reserved_2 = opt->use_reserved_2;
          local_78.use_reserved_3 = opt->use_reserved_3;
          local_78.use_reserved_4 = opt->use_reserved_4;
          local_78.use_reserved_5 = opt->use_reserved_5;
          local_78.use_reserved_6 = opt->use_reserved_6;
          local_78.use_reserved_7 = opt->use_reserved_7;
          local_78.use_reserved_8 = opt->use_reserved_8;
          local_78.use_reserved_9 = opt->use_reserved_9;
          local_78.use_reserved_10 = opt->use_reserved_10;
          local_78.use_reserved_11 = opt->use_reserved_11;
          local_78.blob_allocator = local_198.allocator;
          local_78._32_8_ = uVar3 & 0xffffffffffffff;
          local_108.elemsize = (this->weight_data).elemsize;
          local_108.data = (void *)(local_108.elemsize * lVar8 + (long)(this->weight_data).data);
          local_108.elempack = (this->weight_data).elempack;
          local_108.allocator = (this->weight_data).allocator;
          local_108.refcount = (int *)0x0;
          local_108.dims = 1;
          local_108.h = 1;
          local_108.d = 1;
          local_108.c = 1;
          local_150.elemsize = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
          local_150.data = (void *)(local_150.elemsize * lVar8 + (long)local_198.data);
          local_150.refcount = (int *)0x0;
          local_150.elempack = local_198.elempack;
          local_150.allocator = local_198.allocator;
          local_150.dims = 1;
          local_150.h = 1;
          local_150.d = 1;
          local_150.c = 1;
          local_c0.elemsize = (this->weight_data_int8_scales).elemsize;
          local_c0.data =
               (void *)(local_c0.elemsize * lVar6 + (long)(this->weight_data_int8_scales).data);
          local_c0.elempack = (this->weight_data_int8_scales).elempack;
          local_c0.allocator = (this->weight_data_int8_scales).allocator;
          local_c0.refcount = (int *)0x0;
          local_c0.dims = 1;
          local_c0.w = 1;
          local_c0.h = 1;
          local_c0.d = 1;
          local_c0.c = 1;
          local_c0.cstep = 1;
          local_150.w = iVar5;
          local_150.cstep = sVar7;
          local_108.w = iVar5;
          local_108.cstep = sVar7;
          quantize_to_int8(&local_108,&local_150,&local_c0,&local_78);
          if (local_c0.refcount != (int *)0x0) {
            LOCK();
            *local_c0.refcount = *local_c0.refcount + -1;
            UNLOCK();
            if (*local_c0.refcount == 0) {
              if (local_c0.allocator == (Allocator *)0x0) {
                if (local_c0.data != (void *)0x0) {
                  free(local_c0.data);
                }
              }
              else {
                (*(local_c0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_150.refcount != (int *)0x0) {
            LOCK();
            *local_150.refcount = *local_150.refcount + -1;
            UNLOCK();
            if (*local_150.refcount == 0) {
              if (local_150.allocator == (Allocator *)0x0) {
                if (local_150.data != (void *)0x0) {
                  free(local_150.data);
                }
              }
              else {
                (*(local_150.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_108.refcount != (int *)0x0) {
            LOCK();
            *local_108.refcount = *local_108.refcount + -1;
            UNLOCK();
            if (*local_108.refcount == 0) {
              if (local_108.allocator == (Allocator *)0x0) {
                if (local_108.data != (void *)0x0) {
                  free(local_108.data);
                }
              }
              else {
                (*(local_108.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + sVar7;
        } while (lVar6 < this->group);
      }
      if (&this->weight_data != &local_198) {
        piVar1 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            __ptr = (this->weight_data).data;
            pAVar2 = (this->weight_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).data = local_198.data;
        (this->weight_data).refcount =
             (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        (this->weight_data).elemsize =
             CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
        (this->weight_data).elempack = local_198.elempack;
        (this->weight_data).allocator = local_198.allocator;
        (this->weight_data).dims = local_198.dims;
        (this->weight_data).w = local_198.w;
        (this->weight_data).h = local_198.h;
        (this->weight_data).d = local_198.d;
        (this->weight_data).c = local_198.c;
        (this->weight_data).cstep = local_198.cstep;
      }
      bVar4 = false;
    }
    piVar1 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          if (local_198.data != (void *)0x0) {
            free(local_198.data);
          }
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar4) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#endif // NCNN_INT8

    return 0;
}